

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::FreeConstraintPS::FreeConstraintPS
          (FreeConstraintPS *this,FreeConstraintPS *old)

{
  long in_RSI;
  PostStep *in_RDI;
  PostStep *in_stack_ffffffffffffffe0;
  
  PostStep::PostStep(in_stack_ffffffffffffffe0,in_RDI);
  in_RDI->_vptr_PostStep = (_func_int **)&PTR__FreeConstraintPS_004ecad8;
  *(undefined4 *)&in_RDI[1]._vptr_PostStep = *(undefined4 *)(in_RSI + 0x28);
  *(undefined4 *)((long)&in_RDI[1]._vptr_PostStep + 4) = *(undefined4 *)(in_RSI + 0x2c);
  DSVectorBase<double>::DSVectorBase
            ((DSVectorBase<double> *)in_stack_ffffffffffffffe0,(DSVectorBase<double> *)in_RDI);
  in_RDI[2]._vptr_PostStep = *(_func_int ***)(in_RSI + 0x50);
  return;
}

Assistant:

FreeConstraintPS(const FreeConstraintPS& old)
         : PostStep(old)
         , m_i(old.m_i)
         , m_old_i(old.m_old_i)
         , m_row(old.m_row)
         , m_row_obj(old.m_row_obj)
      {}